

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

int wwCmp2(word *a,size_t n,word *b,size_t m)

{
  uint uVar1;
  uint uVar2;
  bool_t bVar3;
  int iVar4;
  
  if (n < m || n - m == 0) {
    if (n >= m) {
      iVar4 = wwCmp(a,b,n);
      return iVar4;
    }
    bVar3 = wwIsZero(b + n,m - n);
    uVar1 = wwCmp(a,b,n);
    uVar1 = bVar3 - 1U | uVar1;
  }
  else {
    uVar1 = wwIsZero(a + m,n - m);
    uVar2 = wwCmp(a,b,m);
    uVar1 = uVar1 ^ 1 | -uVar1 & uVar2;
  }
  return uVar1;
}

Assistant:

int SAFE(wwCmp2)(const word a[], size_t n, const word b[], size_t m)
{
	register int ret;
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	if (n > m)
	{
		register int z = wwIsZero(a + m, n - m);
		ret = wwCmp(a, b, m);
		ret = -z & ret | (z - 1) & 1;
		z = 0;
	}
	else if (n < m)
	{
		register int z = wwIsZero(b + n, m - n);
		ret = wwCmp(a, b, n);
		ret = -z & ret | (z - 1) & -1;
		z = 0;
	}
	else
		ret = wwCmp(a, b, n);
	return ret;
}